

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O1

void on_send_complete(void *context,IO_SEND_RESULT send_result)

{
  ASYNC_OPERATION_CANCEL_HANDLER_FUNC p_Var1;
  ASYNC_OPERATION_HANDLE async_operation;
  
  async_operation =
       (ASYNC_OPERATION_HANDLE)singlylinkedlist_item_get_value((LIST_ITEM_HANDLE)context);
  if (((async_operation != (ASYNC_OPERATION_HANDLE)0x0) &&
      (p_Var1 = async_operation[4].async_operation_cancel_handler,
      p_Var1 != (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0)) &&
     (p_Var1[0x68] == (_func_void_ASYNC_OPERATION_HANDLE)0x1)) {
    (*async_operation[2].async_operation_cancel_handler)
              ((ASYNC_OPERATION_HANDLE)async_operation[3].async_operation_cancel_handler);
    async_operation_destroy(async_operation);
    singlylinkedlist_remove(*(SINGLYLINKEDLIST_HANDLE *)(p_Var1 + 0x38),(LIST_ITEM_HANDLE)context);
    return;
  }
  return;
}

Assistant:

static void on_send_complete(void* context, IO_SEND_RESULT send_result)
{
    LIST_ITEM_HANDLE delivery_instance_list_item = (LIST_ITEM_HANDLE)context;
    ASYNC_OPERATION_HANDLE pending_delivery_operation = (ASYNC_OPERATION_HANDLE)singlylinkedlist_item_get_value(delivery_instance_list_item);
    if (pending_delivery_operation != NULL)
    {
        DELIVERY_INSTANCE* delivery_instance = (DELIVERY_INSTANCE*)GET_ASYNC_OPERATION_CONTEXT(DELIVERY_INSTANCE, pending_delivery_operation);
        if (delivery_instance != NULL)
        {
            LINK_HANDLE link = (LINK_HANDLE)delivery_instance->link;

            (void)send_result;
            if (link != NULL && 
                link->snd_settle_mode == sender_settle_mode_settled)
            {
                delivery_instance->on_delivery_settled(delivery_instance->callback_context, delivery_instance->delivery_id, send_result == IO_SEND_OK ? LINK_DELIVERY_SETTLE_REASON_SETTLED : LINK_DELIVERY_SETTLE_REASON_NOT_DELIVERED, NULL);
                async_operation_destroy(pending_delivery_operation);
                (void)singlylinkedlist_remove(link->pending_deliveries, delivery_instance_list_item);
            }
        }
    }
}